

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O2

void xz_error(xz_statep state,int err,char *msg)

{
  xmlMallocFunc p_Var1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (state->msg != (char *)0x0) {
    if (state->err != 5) {
      (*xmlFree)(state->msg);
    }
    state->msg = (char *)0x0;
  }
  state->err = err;
  p_Var1 = xmlMalloc;
  if (msg != (char *)0x0) {
    if (err == 5) {
      state->msg = msg;
    }
    else {
      sVar2 = strlen(state->path);
      sVar3 = strlen(msg);
      pcVar4 = (char *)(*p_Var1)(sVar2 + sVar3 + 3);
      state->msg = pcVar4;
      if (pcVar4 != (char *)0x0) {
        strcpy(pcVar4,state->path);
        pcVar4 = state->msg;
        sVar2 = strlen(pcVar4);
        (pcVar4 + sVar2)[0] = ':';
        (pcVar4 + sVar2)[1] = ' ';
        pcVar4[sVar2 + 2] = '\0';
        strcat(state->msg,msg);
        return;
      }
      state->err = 5;
      state->msg = "out of memory";
    }
  }
  return;
}

Assistant:

static void
xz_error(xz_statep state, int err, const char *msg)
{
    /* free previously allocated message and clear */
    if (state->msg != NULL) {
        if (state->err != LZMA_MEM_ERROR)
            xmlFree(state->msg);
        state->msg = NULL;
    }

    /* set error code, and if no message, then done */
    state->err = err;
    if (msg == NULL)
        return;

    /* for an out of memory error, save as static string */
    if (err == LZMA_MEM_ERROR) {
        state->msg = (char *) msg;
        return;
    }

    /* construct error message with path */
    if ((state->msg =
         xmlMalloc(strlen(state->path) + strlen(msg) + 3)) == NULL) {
        state->err = LZMA_MEM_ERROR;
        state->msg = (char *) "out of memory";
        return;
    }
    strcpy(state->msg, state->path);
    strcat(state->msg, ": ");
    strcat(state->msg, msg);
    return;
}